

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

uint8 get8(vorb *z)

{
  uint8 *puVar1;
  size_t sVar2;
  int8 c;
  
  puVar1 = z->stream;
  if (puVar1 == (uint8 *)0x0) {
    sVar2 = (*z->f->read)(z->f->data,&c,1,1);
    if (sVar2 == 1) {
      return c;
    }
  }
  else if (puVar1 < z->stream_end) {
    z->stream = puVar1 + 1;
    return *puVar1;
  }
  z->eof = 1;
  return '\0';
}

Assistant:

static uint8 get8(vorb *z)
{
   if (USE_MEMORY(z)) {
      if (z->stream >= z->stream_end) { z->eof = TRUE; return 0; }
      return *z->stream++;
   }

   #ifndef STB_VORBIS_NO_STDIO
   {
   /* FAudio change! */
   int8 c;
   if (fread(&c, 1, 1, z->f) != 1) { z->eof = TRUE; return 0; }
   return c;
   }
   #endif
}